

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O0

int http_WriteHttpRequest(void *Handle,char *buf,size_t *size,int timeout)

{
  size_t sVar1;
  bool bVar2;
  size_t sVar3;
  size_t tempSize;
  int numWritten;
  int freeTempbuf;
  size_t tempbufSize;
  char *tempbuf;
  http_connection_handle_t *handle;
  size_t *psStack_28;
  int timeout_local;
  size_t *size_local;
  char *buf_local;
  void *Handle_local;
  
  tempbufSize = 0;
  _numWritten = 0;
  bVar2 = false;
  if (((Handle == (void *)0x0) || (size == (size_t *)0x0)) || (buf == (char *)0x0)) {
    if (size != (size_t *)0x0) {
      *size = 0;
    }
    Handle_local._4_4_ = -0x65;
  }
  else {
    handle._4_4_ = timeout;
    psStack_28 = size;
    size_local = (size_t *)buf;
    buf_local = (char *)Handle;
    if (*(int *)((long)Handle + 0x88) == -3) {
      if (*size != 0) {
        tempbufSize = (size_t)malloc(*size + 0x14);
        if ((char *)tempbufSize == (char *)0x0) {
          return -0x68;
        }
        sprintf((char *)tempbufSize,"%zx\r\n",*psStack_28);
        sVar3 = strlen((char *)tempbufSize);
        memcpy((char *)(tempbufSize + sVar3),size_local,*psStack_28);
        sVar1 = *psStack_28;
        ((char *)(tempbufSize + sVar1 + sVar3))[0] = '\r';
        ((char *)(tempbufSize + sVar1 + sVar3))[1] = '\n';
        _numWritten = sVar3 + *psStack_28 + 2;
        bVar2 = true;
      }
    }
    else {
      _numWritten = *size;
      tempbufSize = (size_t)buf;
    }
    Handle_local._4_4_ =
         sock_write((SOCKINFO *)Handle,(char *)tempbufSize,_numWritten,(int *)((long)&handle + 4));
    if (bVar2) {
      free((void *)tempbufSize);
    }
    if (Handle_local._4_4_ < 0) {
      *psStack_28 = 0;
    }
    else {
      *psStack_28 = (long)Handle_local._4_4_;
      Handle_local._4_4_ = 0;
    }
  }
  return Handle_local._4_4_;
}

Assistant:

int http_WriteHttpRequest(void *Handle, char *buf, size_t *size, int timeout)
{
	http_connection_handle_t *handle = (http_connection_handle_t *)Handle;
	char *tempbuf = NULL;
	size_t tempbufSize = 0;
	int freeTempbuf = 0;
	int numWritten = 0;

	if (!handle || !size || !buf) {
		if (size)
			*size = 0;
		return UPNP_E_INVALID_PARAM;
	}
	if (handle->contentLength == UPNP_USING_CHUNKED) {
		if (*size) {
			size_t tempSize = 0;
			tempbuf = malloc(
				*size + CHUNK_HEADER_SIZE + CHUNK_TAIL_SIZE);
			if (!tempbuf)
				return UPNP_E_OUTOF_MEMORY;
			/* begin chunk */
			sprintf(tempbuf, "%zx\r\n", *size);
			tempSize = strlen(tempbuf);
			memcpy(tempbuf + tempSize, buf, *size);
			memcpy(tempbuf + tempSize + *size, "\r\n", 2);
			/* end of chunk */
			tempbufSize = tempSize + *size + 2;
			freeTempbuf = 1;
		}
	} else {
		tempbuf = buf;
		tempbufSize = *size;
	}
	numWritten =
		sock_write(&handle->sock_info, tempbuf, tempbufSize, &timeout);
	if (freeTempbuf)
		free(tempbuf);
	if (numWritten < 0) {
		*size = 0;
		return numWritten;
	} else {
		*size = (size_t)numWritten;
		return UPNP_E_SUCCESS;
	}
}